

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall Channel::handleEvent(Channel *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  ChannelPtr guard;
  Channel *this_local;
  
  if (this->fd_ != -1) {
    guard.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    std::enable_shared_from_this<Channel>::shared_from_this
              ((enable_shared_from_this<Channel> *)local_20);
    if ((((this->revents_ & 0x10U) != 0) && ((this->revents_ & 1U) == 0)) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)&this->closeCallback_), bVar1)) {
      std::function<void_()>::operator()(&this->closeCallback_);
    }
    if ((this->revents_ & 8U) != 0) {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->errorCallback_);
      if (bVar1) {
        std::function<void_()>::operator()(&this->errorCallback_);
      }
      else {
        bVar1 = std::function::operator_cast_to_bool((function *)&this->closeCallback_);
        if (bVar1) {
          std::function<void_()>::operator()(&this->closeCallback_);
        }
      }
    }
    if (((this->revents_ & 0x2003U) != 0) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)&this->readCallback_), bVar1)) {
      std::function<void_()>::operator()(&this->readCallback_);
    }
    if (((this->revents_ & 4U) != 0) &&
       (bVar1 = std::function::operator_cast_to_bool((function *)&this->writeCallback_), bVar1)) {
      std::function<void_()>::operator()(&this->writeCallback_);
    }
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)local_20);
  }
  return;
}

Assistant:

void Channel::handleEvent() {
    if (fd_ == -1) return;
    ChannelPtr guard(shared_from_this());
    if ((revents_ & EPOLLHUP) && !(revents_ & EPOLLIN)) {
        if(closeCallback_) closeCallback_();
    }
    if (revents_ & EPOLLERR) {
        if (errorCallback_) errorCallback_();
        else if (closeCallback_) closeCallback_();
    }
    if (revents_ & (EPOLLIN | EPOLLPRI | EPOLLRDHUP)) {
        if(readCallback_) readCallback_();
    }
    if(revents_ & EPOLLOUT) {
        if(writeCallback_) writeCallback_();
    }
}